

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

QPlatformDropQtResponse
QGuiApplicationPrivate::processDrop
          (QWindow *w,QMimeData *dropData,QPoint *p,DropActions supportedActions,
          MouseButtons buttons,KeyboardModifiers modifiers)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QObject *in_RDI;
  Type in_R8D;
  long in_FS_OFFSET;
  DropAction acceptedAction;
  QDropEvent de;
  QPlatformDropQtResponse response;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffff3c;
  QPointF *in_stack_ffffffffffffff40;
  QPointF *in_stack_ffffffffffffff48;
  QDropEvent *in_stack_ffffffffffffff50;
  DropAction local_a8;
  QFlagsStorage<Qt::KeyboardModifier> modifiers_00;
  QDropEvent local_68;
  Type local_18;
  QPlatformDropQtResponse local_10;
  long local_8;
  
  modifiers_00.i = (Int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_R8D;
  updateMouseAndModifierButtonState
            ((MouseButtons)in_stack_ffffffffffffff3c.i,
             (KeyboardModifiers)in_stack_ffffffffffffff38.i);
  QPointer<QWindow>::operator=
            ((QPointer<QWindow> *)in_stack_ffffffffffffff40,
             (QWindow *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38.i));
  memcpy(&local_68,&DAT_00b92a98,0x40);
  QPointF::QPointF(in_stack_ffffffffffffff40,
                   (QPoint *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38.i));
  QDropEvent::QDropEvent
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (QFlagsStorageHelper<Qt::DropAction,_4>)SUB84((ulong)in_RSI >> 0x20,0),
             (QMimeData *)in_stack_ffffffffffffff40,
             (QFlagsStorageHelper<Qt::MouseButton,_4>)SUB84(in_RSI,0),
             (KeyboardModifiers)modifiers_00.i,local_18);
  QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_68);
  bVar1 = QEvent::isAccepted(&local_68.super_QEvent);
  if (bVar1) {
    local_a8 = QDropEvent::dropAction(&local_68);
  }
  else {
    local_a8 = IgnoreAction;
  }
  local_10 = (QPlatformDropQtResponse)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QEvent::isAccepted(&local_68.super_QEvent);
  QPlatformDropQtResponse::QPlatformDropQtResponse(&local_10,bVar1,local_a8);
  QDropEvent::~QDropEvent((QDropEvent *)0x36ca0e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformDropQtResponse QGuiApplicationPrivate::processDrop(QWindow *w, const QMimeData *dropData,
                                                            const QPoint &p, Qt::DropActions supportedActions,
                                                            Qt::MouseButtons buttons, Qt::KeyboardModifiers modifiers)
{
    updateMouseAndModifierButtonState(buttons, modifiers);

    currentDragWindow = nullptr;

    QDropEvent de(p, supportedActions, dropData, buttons, modifiers);
    QGuiApplication::sendEvent(w, &de);

    Qt::DropAction acceptedAction = de.isAccepted() ? de.dropAction() : Qt::IgnoreAction;
    QPlatformDropQtResponse response(de.isAccepted(),acceptedAction);
    return response;
}